

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRHandler.cc
# Opt level: O1

bool __thiscall flow::IRHandler::isAfter(IRHandler *this,BasicBlock *bb,BasicBlock *afterThat)

{
  _List_node_base *p_Var1;
  list<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>
  *plVar2;
  bool bVar3;
  
  if (bb->handler_ != this) {
    __assert_fail("bb->getHandler() == this",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianparpart[P]flow/src/flow/ir/IRHandler.cc"
                  ,0x48,
                  "bool flow::IRHandler::isAfter(const BasicBlock *, const BasicBlock *) const");
  }
  if (afterThat->handler_ == this) {
    plVar2 = &this->blocks_;
    for (p_Var1 = (this->blocks_).
                  super__List_base<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>
                  ._M_impl._M_node.super__List_node_base._M_next;
        (p_Var1 != (_List_node_base *)plVar2 && ((BasicBlock *)p_Var1[1]._M_next != bb));
        p_Var1 = p_Var1->_M_next) {
    }
    if ((p_Var1 == (_List_node_base *)plVar2) || (p_Var1->_M_next == (_List_node_base *)plVar2)) {
      bVar3 = false;
    }
    else {
      bVar3 = (BasicBlock *)p_Var1->_M_next[1]._M_next == afterThat;
    }
    return bVar3;
  }
  __assert_fail("afterThat->getHandler() == this",
                "/workspace/llm4binary/github/license_all_cmakelists_25/christianparpart[P]flow/src/flow/ir/IRHandler.cc"
                ,0x49,"bool flow::IRHandler::isAfter(const BasicBlock *, const BasicBlock *) const")
  ;
}

Assistant:

bool IRHandler::isAfter(const BasicBlock* bb, const BasicBlock* afterThat) const {
  assert(bb->getHandler() == this);
  assert(afterThat->getHandler() == this);

  auto i = std::find_if(blocks_.cbegin(), blocks_.cend(),
                       [&](const auto& obj) { return obj.get() == bb; });

  if (i == blocks_.cend())
    return false;

  ++i;

  if (i == blocks_.cend())
    return false;

  return i->get() == afterThat;
}